

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O1

XSSimpleTypeDefinition * __thiscall
xercesc_4_0::XSObjectFactory::addOrFind
          (XSObjectFactory *this,DatatypeValidator *validator,XSModel *xsModel,bool isAnySimpleType)

{
  DatatypeValidator *validator_00;
  BaseRefVectorOf<xercesc_4_0::DatatypeValidator> *this_00;
  XMLSize_t maxElems;
  XMLSize_t XVar1;
  bool bVar2;
  XSSimpleTypeDefinition *pXVar3;
  BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *this_01;
  DatatypeValidator *validator_01;
  XSAnnotation *headAnnot;
  XMLSize_t i;
  XMLSize_t getAt;
  VARIETY local_60;
  XSSimpleTypeDefinition *local_58;
  XSSimpleTypeDefinition *local_48;
  
  pXVar3 = (XSSimpleTypeDefinition *)XSModel::getXSObject(xsModel,validator);
  if (pXVar3 != (XSSimpleTypeDefinition *)0x0) {
    return pXVar3;
  }
  validator_00 = validator->fBaseValidator;
  if (validator->fType == List) {
    if (validator_00->fType == List) {
      local_58 = addOrFind(this,validator_00,xsModel,false);
      local_48 = (XSSimpleTypeDefinition *)0x0;
      if (local_58->fVariety == VARIETY_LIST) {
        local_48 = local_58->fPrimitiveOrItemType;
      }
      local_60 = VARIETY_LIST;
LAB_002cf9cf:
      this_01 = (BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)0x0;
      bVar2 = false;
      goto LAB_002cfa86;
    }
    local_58 = (XSSimpleTypeDefinition *)
               XSModel::getTypeDefinition
                         (xsModel,L"anySimpleType",L"http://www.w3.org/2001/XMLSchema");
    bVar2 = false;
    local_48 = addOrFind(this,validator_00,xsModel,false);
    local_60 = VARIETY_LIST;
  }
  else {
    if (validator->fType == Union) {
      this_00 = *(BaseRefVectorOf<xercesc_4_0::DatatypeValidator> **)&validator[1].fFinalSet;
      maxElems = this_00->fCurCount;
      if (maxElems == 0) {
        this_01 = (BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)0x0;
      }
      else {
        this_01 = (BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)
                  XMemory::operator_new(0x30,this->fMemoryManager);
        BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition>::BaseRefVectorOf
                  (this_01,maxElems,false,this->fMemoryManager);
        this_01->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00415cd0;
        getAt = 0;
        do {
          validator_01 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt(this_00,getAt);
          pXVar3 = addOrFind(this,validator_01,xsModel,false);
          BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition>::ensureExtraCapacity(this_01,1);
          XVar1 = this_01->fCurCount;
          this_01->fElemList[XVar1] = pXVar3;
          this_01->fCurCount = XVar1 + 1;
          getAt = getAt + 1;
        } while (maxElems != getAt);
      }
      if (validator_00 == (DatatypeValidator *)0x0) {
        local_58 = (XSSimpleTypeDefinition *)
                   XSModel::getTypeDefinition
                             (xsModel,L"anySimpleType",L"http://www.w3.org/2001/XMLSchema");
      }
      else {
        local_58 = addOrFind(this,validator_00,xsModel,false);
      }
      bVar2 = false;
      local_60 = VARIETY_UNION;
      local_48 = (XSSimpleTypeDefinition *)0x0;
      goto LAB_002cfa86;
    }
    if (isAnySimpleType) {
      local_58 = (XSSimpleTypeDefinition *)
                 XSModel::getTypeDefinition(xsModel,L"anyType",L"http://www.w3.org/2001/XMLSchema");
      bVar2 = false;
    }
    else {
      if (validator_00 != (DatatypeValidator *)0x0) {
        local_58 = addOrFind(this,validator_00,xsModel,false);
        local_48 = (XSSimpleTypeDefinition *)0x0;
        if (local_58->fVariety == VARIETY_ATOMIC) {
          local_48 = local_58->fPrimitiveOrItemType;
        }
        local_60 = VARIETY_ATOMIC;
        goto LAB_002cf9cf;
      }
      local_58 = (XSSimpleTypeDefinition *)
                 XSModel::getTypeDefinition
                           (xsModel,L"anySimpleType",L"http://www.w3.org/2001/XMLSchema");
      bVar2 = true;
    }
    local_60 = VARIETY_ATOMIC;
    local_48 = (XSSimpleTypeDefinition *)0x0;
  }
  this_01 = (BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)0x0;
LAB_002cfa86:
  pXVar3 = (XSSimpleTypeDefinition *)XMemory::operator_new(0x80,this->fMemoryManager);
  headAnnot = getAnnotationFromModel(this,xsModel,validator);
  XSSimpleTypeDefinition::XSSimpleTypeDefinition
            (pXVar3,validator,local_60,&local_58->super_XSTypeDefinition,local_48,
             (XSSimpleTypeDefinitionList *)this_01,headAnnot,xsModel,this->fMemoryManager);
  putObjectInMap(this,validator,(XSObject *)pXVar3);
  if (bVar2) {
    pXVar3->fPrimitiveOrItemType = pXVar3;
  }
  processFacets(this,validator,xsModel,pXVar3);
  return pXVar3;
}

Assistant:

XSSimpleTypeDefinition*
XSObjectFactory::addOrFind(DatatypeValidator* const validator,
                           XSModel* const xsModel,
                           bool isAnySimpleType)
{
    XSSimpleTypeDefinition* xsObj = (XSSimpleTypeDefinition*) xsModel->getXSObject(validator);
    if (!xsObj)
    {
        XSTypeDefinition* baseType = 0;
        XSSimpleTypeDefinitionList* memberTypes = 0;
        XSSimpleTypeDefinition* primitiveOrItemType = 0;
        XSSimpleTypeDefinition::VARIETY typeVariety = XSSimpleTypeDefinition::VARIETY_ATOMIC;
        bool primitiveTypeSelf = false;

        //REVISIT: the getFixed method is protected so added friend XSObjectFactory
        //         to DatatypeValidator class...
        DatatypeValidator::ValidatorType dvType = validator->getType();
        DatatypeValidator* baseDV = validator->getBaseValidator();

        if (dvType == DatatypeValidator::Union)
        {
            typeVariety = XSSimpleTypeDefinition::VARIETY_UNION;
            RefVectorOf<DatatypeValidator>* membersDV = ((UnionDatatypeValidator*)validator)->getMemberTypeValidators();
            XMLSize_t size = membersDV->size();
            if (size)
            {
                memberTypes = new (fMemoryManager) RefVectorOf<XSSimpleTypeDefinition>(size, false, fMemoryManager);
                for (XMLSize_t i=0; i<size; i++)
                    memberTypes->addElement(addOrFind(membersDV->elementAt(i), xsModel));
            }

            if (baseDV)
            {
                baseType = addOrFind(baseDV, xsModel);
            }
            else
            {
                baseType = (XSSimpleTypeDefinition*) xsModel->getTypeDefinition
                (
                    SchemaSymbols::fgDT_ANYSIMPLETYPE
                    , SchemaSymbols::fgURI_SCHEMAFORSCHEMA
                );
            }
        }
        else if (dvType == DatatypeValidator::List)
        {
            typeVariety = XSSimpleTypeDefinition::VARIETY_LIST;
            if (baseDV->getType() == DatatypeValidator::List)
            {
                baseType = addOrFind(baseDV, xsModel);
                primitiveOrItemType = ((XSSimpleTypeDefinition*) baseType)->getItemType();
            }
            else
            {
                baseType = (XSSimpleTypeDefinition*) xsModel->getTypeDefinition
                (
                    SchemaSymbols::fgDT_ANYSIMPLETYPE
                    , SchemaSymbols::fgURI_SCHEMAFORSCHEMA
                );
                primitiveOrItemType = addOrFind(baseDV, xsModel);
            }
        }
        else if (!isAnySimpleType)
        {
            if (baseDV)
            {
                baseType = addOrFind(baseDV, xsModel);
                primitiveOrItemType = ((XSSimpleTypeDefinition*) baseType)->getPrimitiveType();
            }
            else // built-in
            {
                baseType = (XSSimpleTypeDefinition*) xsModel->getTypeDefinition
                (
                    SchemaSymbols::fgDT_ANYSIMPLETYPE
                    , SchemaSymbols::fgURI_SCHEMAFORSCHEMA
                );
                primitiveTypeSelf = true;
            }
        }
        else
        {
            baseType = xsModel->getTypeDefinition(SchemaSymbols::fgATTVAL_ANYTYPE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
        }

        xsObj = new (fMemoryManager) XSSimpleTypeDefinition
        (
            validator
            , typeVariety
            , baseType
            , primitiveOrItemType
            , memberTypes
            , getAnnotationFromModel(xsModel, validator)
            , xsModel
            , fMemoryManager
        );
        putObjectInMap(validator, xsObj);

        if (primitiveTypeSelf)
            xsObj->setPrimitiveType(xsObj);

        // process facets
        processFacets(validator, xsModel, xsObj);
    }

    return xsObj;
}